

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::debugReportRowPrice
          (HighsSparseMatrix *this,HighsInt iRow,double multiplier,HighsInt to_iEl,
          vector<double,_std::allocator<double>_> *result)

{
  uint uVar1;
  const_reference pvVar2;
  uint *puVar3;
  const_reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RCX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double value2;
  double value1;
  double value0;
  HighsInt iCol;
  HighsInt iEl;
  HighsInt num_print;
  double local_70;
  int local_30;
  int local_2c;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)(int)in_ESI);
  if (*pvVar2 < in_EDX) {
    printf("Row %d: value = %11.4g",in_XMM0_Da,(ulong)in_ESI);
    local_2c = 0;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)(int)in_ESI);
    for (local_30 = *pvVar2; local_30 < in_EDX; local_30 = local_30 + 1) {
      puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),
                                  (long)local_30);
      uVar1 = *puVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)(int)uVar1);
      local_70 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_30)
      ;
      local_70 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da) * *pvVar4 + local_70;
      if (ABS(local_70) < 1e-14) {
        local_70 = 1e-50;
      }
      if (local_2c % 5 == 0) {
        printf("\n");
      }
      printf("[%4d %11.4g] ",SUB84(local_70,0),(ulong)uVar1);
      local_2c = local_2c + 1;
    }
    printf("\n");
  }
  return;
}

Assistant:

void HighsSparseMatrix::debugReportRowPrice(
    const HighsInt iRow, const double multiplier, const HighsInt to_iEl,
    const vector<double>& result) const {
  if (this->start_[iRow] >= to_iEl) return;
  printf("Row %d: value = %11.4g", (int)iRow, multiplier);
  HighsInt num_print = 0;
  for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
    HighsInt iCol = this->index_[iEl];
    double value0 = result[iCol];
    double value1 = value0 + multiplier * this->value_[iEl];
    double value2 = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    if (num_print % 5 == 0) printf("\n");
    printf("[%4d %11.4g] ", (int)(iCol), value2);
    num_print++;
  }
  printf("\n");
}